

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
               *this,raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                     *that,allocator_type *a)

{
  _Head_base<0UL,_unsigned_long,_false> *p_Var1;
  char cVar2;
  ctrl_t *pcVar3;
  size_t sVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [12];
  undefined1 auVar15 [13];
  undefined1 auVar16 [14];
  uint uVar18;
  size_t hashval;
  value_type *v;
  anon_union_8_1_a8a14541_for_iterator_1 aVar19;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  iterator iVar20;
  FindInfo FVar21;
  char *pcVar17;
  
  this->size_ = 0;
  this->capacity_ = 0;
  this->ctrl_ = (ctrl_t *)0x0;
  this->slots_ = (slot_type *)0x0;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>.
  super__Tuple_impl<3UL,_phmap::priv::Alloc<int>_>.
  super__Head_base<3UL,_phmap::priv::Alloc<int>,_false>._M_head_impl.id_ = a->id_;
  sVar4 = (that->settings_).
          super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
          .
          super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
          .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
          super_WithId<phmap::priv::StatefulTestingHash>.id_;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>.
  super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (that->settings_).
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
       .super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>.
       super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
       super_WithId<phmap::priv::StatefulTestingEqual>.id_;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingHash>.id_ = sVar4;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  rehash(this,that->capacity_);
  iVar20 = begin(that);
  pcVar17 = iVar20.ctrl_;
  pcVar3 = that->ctrl_;
  sVar4 = that->capacity_;
  while (pcVar17 != pcVar3 + sVar4) {
    aVar19 = iVar20.field_1;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)*aVar19.slot_;
    hashval = SUB168(auVar6 * ZEXT816(0xde5fb9d2630458e9),8) +
              SUB168(auVar6 * ZEXT816(0xde5fb9d2630458e9),0);
    FVar21 = find_first_non_full(this,hashval);
    set_ctrl(this,FVar21.offset,(byte)hashval & 0x7f);
    this->slots_[FVar21.offset] = *aVar19.slot_;
    aVar19.slot_ = aVar19.slot_ + 1;
    cVar2 = iVar20.ctrl_[1];
    pcVar17 = iVar20.ctrl_ + 1;
    while (cVar2 < -1) {
      iVar9 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                     CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar10 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar11 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar12 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar17 < (char)iVar9);
      in_XMM1_Bb = -(pcVar17[1] < (char)((uint)iVar9 >> 8));
      in_XMM1_Bc = -(pcVar17[2] < (char)((uint)iVar9 >> 0x10));
      in_XMM1_Bd = -(pcVar17[3] < (char)((uint)iVar9 >> 0x18));
      in_XMM1_Be = -(pcVar17[4] < (char)iVar10);
      in_XMM1_Bf = -(pcVar17[5] < (char)((uint)iVar10 >> 8));
      in_XMM1_Bg = -(pcVar17[6] < (char)((uint)iVar10 >> 0x10));
      in_XMM1_Bh = -(pcVar17[7] < (char)((uint)iVar10 >> 0x18));
      in_XMM1_Bi = -(pcVar17[8] < (char)iVar11);
      in_XMM1_Bj = -(pcVar17[9] < (char)((uint)iVar11 >> 8));
      in_XMM1_Bk = -(pcVar17[10] < (char)((uint)iVar11 >> 0x10));
      in_XMM1_Bl = -(pcVar17[0xb] < (char)((uint)iVar11 >> 0x18));
      in_XMM1_Bm = -(pcVar17[0xc] < (char)iVar12);
      in_XMM1_Bn = -(pcVar17[0xd] < (char)((uint)iVar12 >> 8));
      in_XMM1_Bo = -(pcVar17[0xe] < (char)((uint)iVar12 >> 0x10));
      in_XMM1_Bp = -(pcVar17[0xf] < (char)((uint)iVar12 >> 0x18));
      auVar7[1] = in_XMM1_Bb;
      auVar7[0] = in_XMM1_Ba;
      auVar7[2] = in_XMM1_Bc;
      auVar7[3] = in_XMM1_Bd;
      auVar7[4] = in_XMM1_Be;
      auVar7[5] = in_XMM1_Bf;
      auVar7[6] = in_XMM1_Bg;
      auVar7[7] = in_XMM1_Bh;
      auVar7[8] = in_XMM1_Bi;
      auVar7[9] = in_XMM1_Bj;
      auVar7[10] = in_XMM1_Bk;
      auVar7[0xb] = in_XMM1_Bl;
      auVar7[0xc] = in_XMM1_Bm;
      auVar7[0xd] = in_XMM1_Bn;
      auVar7[0xe] = in_XMM1_Bo;
      auVar7[0xf] = in_XMM1_Bp;
      auVar8[1] = in_XMM1_Bb;
      auVar8[0] = in_XMM1_Ba;
      auVar8[2] = in_XMM1_Bc;
      auVar8[3] = in_XMM1_Bd;
      auVar8[4] = in_XMM1_Be;
      auVar8[5] = in_XMM1_Bf;
      auVar8[6] = in_XMM1_Bg;
      auVar8[7] = in_XMM1_Bh;
      auVar8[8] = in_XMM1_Bi;
      auVar8[9] = in_XMM1_Bj;
      auVar8[10] = in_XMM1_Bk;
      auVar8[0xb] = in_XMM1_Bl;
      auVar8[0xc] = in_XMM1_Bm;
      auVar8[0xd] = in_XMM1_Bn;
      auVar8[0xe] = in_XMM1_Bo;
      auVar8[0xf] = in_XMM1_Bp;
      auVar16[1] = in_XMM1_Bd;
      auVar16[0] = in_XMM1_Bc;
      auVar16[2] = in_XMM1_Be;
      auVar16[3] = in_XMM1_Bf;
      auVar16[4] = in_XMM1_Bg;
      auVar16[5] = in_XMM1_Bh;
      auVar16[6] = in_XMM1_Bi;
      auVar16[7] = in_XMM1_Bj;
      auVar16[8] = in_XMM1_Bk;
      auVar16[9] = in_XMM1_Bl;
      auVar16[10] = in_XMM1_Bm;
      auVar16[0xb] = in_XMM1_Bn;
      auVar16[0xc] = in_XMM1_Bo;
      auVar16[0xd] = in_XMM1_Bp;
      auVar15[1] = in_XMM1_Be;
      auVar15[0] = in_XMM1_Bd;
      auVar15[2] = in_XMM1_Bf;
      auVar15[3] = in_XMM1_Bg;
      auVar15[4] = in_XMM1_Bh;
      auVar15[5] = in_XMM1_Bi;
      auVar15[6] = in_XMM1_Bj;
      auVar15[7] = in_XMM1_Bk;
      auVar15[8] = in_XMM1_Bl;
      auVar15[9] = in_XMM1_Bm;
      auVar15[10] = in_XMM1_Bn;
      auVar15[0xb] = in_XMM1_Bo;
      auVar15[0xc] = in_XMM1_Bp;
      auVar14[1] = in_XMM1_Bf;
      auVar14[0] = in_XMM1_Be;
      auVar14[2] = in_XMM1_Bg;
      auVar14[3] = in_XMM1_Bh;
      auVar14[4] = in_XMM1_Bi;
      auVar14[5] = in_XMM1_Bj;
      auVar14[6] = in_XMM1_Bk;
      auVar14[7] = in_XMM1_Bl;
      auVar14[8] = in_XMM1_Bm;
      auVar14[9] = in_XMM1_Bn;
      auVar14[10] = in_XMM1_Bo;
      auVar14[0xb] = in_XMM1_Bp;
      auVar13[1] = in_XMM1_Bg;
      auVar13[0] = in_XMM1_Bf;
      auVar13[2] = in_XMM1_Bh;
      auVar13[3] = in_XMM1_Bi;
      auVar13[4] = in_XMM1_Bj;
      auVar13[5] = in_XMM1_Bk;
      auVar13[6] = in_XMM1_Bl;
      auVar13[7] = in_XMM1_Bm;
      auVar13[8] = in_XMM1_Bn;
      auVar13[9] = in_XMM1_Bo;
      auVar13[10] = in_XMM1_Bp;
      uVar18 = (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar16 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar15 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar14 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar13 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar5 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      aVar19.slot_ = aVar19.slot_ + uVar5;
      cVar2 = pcVar17[uVar5];
      pcVar17 = pcVar17 + uVar5;
    }
    iVar20.field_1.slot_ = aVar19.slot_;
    iVar20.ctrl_ = pcVar17;
  }
  sVar4 = that->size_;
  this->size_ = sVar4;
  p_Var1 = &(this->settings_).
            super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
            .super__Head_base<0UL,_unsigned_long,_false>;
  p_Var1->_M_head_impl = p_Var1->_M_head_impl - sVar4;
  return;
}

Assistant:

raw_hash_set(const raw_hash_set& that, const allocator_type& a)
        : raw_hash_set(0, that.hash_ref(), that.eq_ref(), a) {
        rehash(that.capacity());   // operator=() should preserve load_factor
        // Because the table is guaranteed to be empty, we can do something faster
        // than a full `insert`.
        for (const auto& v : that) {
            const size_t hashval = PolicyTraits::apply(HashElement{hash_ref()}, v);
            auto target = find_first_non_full(hashval);
            set_ctrl(target.offset, H2(hashval));
            emplace_at(target.offset, v);
            infoz_.RecordInsert(hashval, target.probe_length);
        }
        size_ = that.size();
        growth_left() -= that.size();
    }